

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

bool __thiscall
slang::ast::detail::ClassSpecializationKey::operator==
          (ClassSpecializationKey *this,ClassSpecializationKey *other)

{
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_00;
  Type *rhs_00;
  bool bVar1;
  pointer ppCVar2;
  pointer ppTVar3;
  pointer ppCVar4;
  pointer ppTVar5;
  bool bVar6;
  
  if (((this->savedHash == other->savedHash) &&
      ((this->paramValues)._M_extent._M_extent_value ==
       (other->paramValues)._M_extent._M_extent_value)) &&
     ((this->typeParams)._M_extent._M_extent_value == (other->typeParams)._M_extent._M_extent_value)
     ) {
    bVar6 = (this->paramValues)._M_extent._M_extent_value == 0;
    if (!bVar6) {
      ppCVar4 = (other->paramValues)._M_ptr;
      ppCVar2 = (this->paramValues)._M_ptr;
      do {
        lhs = *ppCVar2;
        rhs = *ppCVar4;
        if (rhs == (ConstantValue *)0x0 || lhs == (ConstantValue *)0x0) {
          if (lhs != rhs) goto LAB_007838e9;
        }
        else {
          bVar1 = slang::operator==(lhs,rhs);
          if (!bVar1) {
LAB_007838e9:
            if (!bVar6) goto LAB_0078394a;
            break;
          }
        }
        ppCVar2 = ppCVar2 + 1;
        ppCVar4 = ppCVar4 + 1;
        bVar6 = ppCVar2 ==
                (this->paramValues)._M_ptr + (this->paramValues)._M_extent._M_extent_value;
      } while (!bVar6);
    }
    bVar6 = (this->typeParams)._M_extent._M_extent_value == 0;
    if (!bVar6) {
      ppTVar3 = (other->typeParams)._M_ptr;
      ppTVar5 = (this->typeParams)._M_ptr;
      do {
        this_00 = *ppTVar5;
        rhs_00 = *ppTVar3;
        if (rhs_00 == (Type *)0x0 || this_00 == (Type *)0x0) {
          if (this_00 != rhs_00) {
            return bVar6;
          }
        }
        else {
          bVar1 = Type::isMatching(this_00,rhs_00);
          if (!bVar1) {
            return bVar6;
          }
        }
        ppTVar5 = ppTVar5 + 1;
        ppTVar3 = ppTVar3 + 1;
        bVar6 = ppTVar5 == (this->typeParams)._M_ptr + (this->typeParams)._M_extent._M_extent_value;
      } while (!bVar6);
    }
  }
  else {
LAB_0078394a:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ClassSpecializationKey::operator==(const ClassSpecializationKey& other) const {
    if (savedHash != other.savedHash || paramValues.size() != other.paramValues.size() ||
        typeParams.size() != other.typeParams.size()) {
        return false;
    }

    for (auto lit = paramValues.begin(), rit = other.paramValues.begin(); lit != paramValues.end();
         lit++, rit++) {
        const ConstantValue* l = *lit;
        const ConstantValue* r = *rit;
        if (l && r) {
            if (!(*l == *r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    for (auto lit = typeParams.begin(), rit = other.typeParams.begin(); lit != typeParams.end();
         lit++, rit++) {
        const Type* l = *lit;
        const Type* r = *rit;
        if (l && r) {
            if (!l->isMatching(*r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    return true;
}